

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hes_Apu.cpp
# Opt level: O0

void __thiscall Hes_Apu::reset(Hes_Apu *this)

{
  void *__s;
  void *in_RDI;
  Hes_Osc *osc;
  undefined8 local_10;
  
  *(undefined4 *)((long)in_RDI + 0x2a0) = 0;
  *(undefined4 *)((long)in_RDI + 0x2a4) = 0xff;
  local_10 = (void *)((long)in_RDI + 0x2a0);
  do {
    __s = (void *)((long)local_10 + -0x70);
    memset(__s,0,0x40);
    *(undefined4 *)((long)local_10 + -8) = 1;
    *(undefined1 *)((long)local_10 + -4) = 0x40;
    *(undefined1 *)((long)local_10 + -0x3a) = 0xff;
    local_10 = __s;
  } while (__s != in_RDI);
  return;
}

Assistant:

void Hes_Apu::reset()
{
	latch   = 0;
	balance = 0xFF;
	
	Hes_Osc* osc = &oscs [osc_count];
	do
	{
		osc--;
		memset( osc, 0, offsetof (Hes_Osc,outputs) );
		osc->noise_lfsr = 1;
		osc->control    = 0x40;
		osc->balance    = 0xFF;
	}
	while ( osc != oscs );
}